

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::extractClassName_abi_cxx11_
          (string *__return_storage_ptr__,Catch *this,StringRef *classOrQualifiedMethodName)

{
  long lVar1;
  long lVar2;
  size_type sVar3;
  size_type sVar4;
  size_type __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar1,lVar2 + lVar1);
  if ((__return_storage_ptr__->_M_string_length != 0) &&
     (*(__return_storage_ptr__->_M_dataplus)._M_p == '&')) {
    sVar3 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            rfind(__return_storage_ptr__,"::",0xffffffffffffffff,2);
    sVar4 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            rfind(__return_storage_ptr__,"::",sVar3 - 1,2);
    __pos = 1;
    if (sVar4 != 0xffffffffffffffff) {
      __pos = sVar4;
    }
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_40,__return_storage_ptr__,__pos,sVar3 - __pos);
    extractClassName_abi_cxx11_();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string extractClassName( StringRef const& classOrQualifiedMethodName ) {
        std::string className(classOrQualifiedMethodName);
        if( startsWith( className, '&' ) )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }